

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshrec.c
# Opt level: O1

FT_Error ps_mask_table_alloc(PS_Mask_Table table,FT_Memory memory,PS_Mask *amask)

{
  uint uVar1;
  ulong in_RAX;
  PS_Mask pPVar2;
  int iVar3;
  uint uVar4;
  FT_Error error;
  undefined8 uStack_38;
  
  uVar1 = table->num_masks + 1;
  uStack_38 = in_RAX;
  if (table->max_masks < uVar1) {
    uStack_38 = in_RAX & 0xffffffff;
    uVar4 = (table->num_masks & 0xfffffff8) + 8;
    pPVar2 = (PS_Mask)ft_mem_realloc(memory,0x18,(ulong)table->max_masks,(ulong)uVar4,table->masks,
                                     (FT_Error *)((long)&uStack_38 + 4));
    table->masks = pPVar2;
    if (uStack_38._4_4_ != 0) {
      pPVar2 = (PS_Mask)0x0;
      iVar3 = uStack_38._4_4_;
      goto LAB_0023e617;
    }
    table->max_masks = uVar4;
  }
  pPVar2 = table->masks;
  iVar3 = 0;
  pPVar2[(ulong)uVar1 - 1].num_bits = 0;
  pPVar2[(ulong)uVar1 - 1].end_point = 0;
  if (pPVar2[(ulong)uVar1 - 1].max_bits != 0) {
    memset(pPVar2[(ulong)uVar1 - 1].bytes,0,(ulong)(pPVar2[(ulong)uVar1 - 1].max_bits >> 3));
  }
  pPVar2 = pPVar2 + ((ulong)uVar1 - 1);
  table->num_masks = uVar1;
LAB_0023e617:
  *amask = pPVar2;
  return iVar3;
}

Assistant:

static FT_Error
  ps_mask_table_alloc( PS_Mask_Table  table,
                       FT_Memory      memory,
                       PS_Mask       *amask )
  {
    FT_UInt   count;
    FT_Error  error = FT_Err_Ok;
    PS_Mask   mask  = NULL;


    count = table->num_masks;
    count++;

    if ( count > table->max_masks )
    {
      error = ps_mask_table_ensure( table, count, memory );
      if ( error )
        goto Exit;
    }

    mask             = table->masks + count - 1;
    mask->num_bits   = 0;
    mask->end_point  = 0;
    /* reused mask must be cleared */
    if ( mask->max_bits )
      FT_MEM_ZERO( mask->bytes, mask->max_bits >> 3 );

    table->num_masks = count;

  Exit:
    *amask = mask;
    return error;
  }